

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O1

time_t zip_time(char *p)

{
  time_t tVar1;
  tm_conflict ts;
  tm local_38;
  
  local_38.tm_wday = 0;
  local_38.tm_yday = 0;
  local_38.tm_gmtoff = 0;
  local_38.tm_zone = (char *)0x0;
  local_38.tm_year = ((byte)p[3] >> 1) + 0x50;
  local_38.tm_mon = (*(ushort *)(p + 2) >> 5 & 0xf) - 1;
  local_38._8_8_ = (ulong)CONCAT14((char)*(ushort *)(p + 2),(uint)((byte)p[1] >> 3)) & 0x1fffffffff;
  local_38._0_8_ = (ulong)CONCAT24(*(ushort *)p >> 5,(uint)(byte)*p + (uint)(byte)*p) & 0x3f0000003e
  ;
  local_38.tm_isdst = -1;
  local_38._36_4_ = 0;
  tVar1 = mktime(&local_38);
  return tVar1;
}

Assistant:

static time_t
zip_time(const char *p)
{
	int msTime, msDate;
	struct tm ts;

	msTime = (0xff & (unsigned)p[0]) + 256 * (0xff & (unsigned)p[1]);
	msDate = (0xff & (unsigned)p[2]) + 256 * (0xff & (unsigned)p[3]);

	memset(&ts, 0, sizeof(ts));
	ts.tm_year = ((msDate >> 9) & 0x7f) + 80; /* Years since 1900. */
	ts.tm_mon = ((msDate >> 5) & 0x0f) - 1; /* Month number. */
	ts.tm_mday = msDate & 0x1f; /* Day of month. */
	ts.tm_hour = (msTime >> 11) & 0x1f;
	ts.tm_min = (msTime >> 5) & 0x3f;
	ts.tm_sec = (msTime << 1) & 0x3e;
	ts.tm_isdst = -1;
	return mktime(&ts);
}